

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec,int *vidx,
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *rhs,int *ridx,int rn,
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *eps)

{
  fpclass_type fVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  int32_t iVar4;
  bool bVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  byte bVar16;
  uint uVar17;
  int *piVar18;
  uint uVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  uint *puVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar23;
  cpp_dec_float<200U,_int,_void> *pcVar24;
  cpp_dec_float<200U,_int,_void> *pcVar25;
  int iVar26;
  cpp_dec_float<200U,_int,_void> *pcVar27;
  cpp_dec_float<200U,_int,_void> *pcVar28;
  uint uVar29;
  int *piVar30;
  ulong uVar31;
  ulong uVar32;
  byte bVar33;
  double a;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  ulong local_440;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  uint local_3d8 [3];
  undefined3 uStack_3cb;
  int iStack_3c8;
  bool bStack_3c4;
  undefined8 local_3c0;
  int *local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  ulong local_3a0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_398;
  long local_390;
  int *local_388;
  pointer local_380;
  int *local_378;
  int *local_370;
  int *local_368;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_360;
  int *local_358;
  int *local_350;
  undefined1 local_348 [32];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [13];
  undefined3 uStack_2db;
  int iStack_2d8;
  bool bStack_2d4;
  undefined8 local_2d0;
  int *local_2c0;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [13];
  undefined3 uStack_24b;
  int iStack_248;
  bool bStack_244;
  undefined8 local_240;
  cpp_dec_float<200U,_int,_void> local_230;
  cpp_dec_float<200U,_int,_void> local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar33 = 0;
  local_2d0._0_4_ = cpp_dec_float_finite;
  local_2d0._4_4_ = 0x1c;
  local_348._0_16_ = (undefined1  [16])0x0;
  local_348._16_16_ = (undefined1  [16])0x0;
  local_328 = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  local_308 = (undefined1  [16])0x0;
  local_2f8 = (undefined1  [16])0x0;
  local_2e8 = SUB1613((undefined1  [16])0x0,0);
  uVar31 = 0;
  uStack_2db = 0;
  iStack_2d8 = 0;
  bStack_2d4 = false;
  local_240._0_4_ = cpp_dec_float_finite;
  local_240._4_4_ = 0x1c;
  local_2b8._0_16_ = (undefined1  [16])0x0;
  local_2b8._16_16_ = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_258 = SUB1613((undefined1  [16])0x0,0);
  uStack_24b = 0;
  iStack_248 = 0;
  bStack_244 = false;
  if (0 < rn) {
    piVar18 = (this->row).orig;
    local_2c0 = (this->row).perm;
    local_368 = (this->col).orig;
    local_378 = (this->u).col.idx;
    local_380 = (this->u).col.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_370 = (this->u).col.len;
    local_388 = (this->u).col.start;
    uVar31 = 0;
    local_3b0 = piVar18;
    local_3a8 = rhs;
    local_398 = this;
    local_360 = vec;
    local_358 = vidx;
    local_350 = ridx;
    do {
      local_390 = (long)*ridx;
      uVar29 = rn - 1;
      local_440 = (ulong)uVar29;
      iVar8 = ridx[local_440];
      iVar11 = 1;
      iVar10 = 0;
      if (3 < (uint)rn) {
        iVar10 = 0;
        do {
          iVar9 = ridx[iVar11];
          iVar26 = ridx[(long)iVar11 + 1];
          if (iVar26 < iVar9) {
            iVar12 = iVar11;
            iVar26 = iVar9;
            if (iVar9 <= iVar8) goto LAB_005347f8;
          }
          else {
            if (iVar26 <= iVar8) goto LAB_005347f8;
            iVar12 = iVar11 + 1;
          }
          ridx[iVar10] = iVar26;
          iVar11 = iVar12 * 2 + 1;
          iVar10 = iVar12;
        } while (iVar11 < (int)(rn - 2U));
      }
      if ((iVar11 < (int)uVar29) && (iVar8 < ridx[iVar11])) {
        ridx[iVar10] = ridx[iVar11];
        iVar10 = iVar11;
      }
LAB_005347f8:
      ridx[iVar10] = iVar8;
      pcVar24 = &local_3a8[piVar18[local_390]].m_backend;
      pcVar28 = &(local_398->diag).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[piVar18[local_390]].m_backend;
      local_3c0._0_4_ = cpp_dec_float_finite;
      local_3c0._4_4_ = 0x1c;
      local_438 = (undefined1  [16])0x0;
      local_428 = (undefined1  [16])0x0;
      local_418 = (undefined1  [16])0x0;
      local_408 = (undefined1  [16])0x0;
      local_3f8 = (undefined1  [16])0x0;
      local_3e8 = (undefined1  [16])0x0;
      local_3d8[0] = 0;
      local_3d8[1] = 0;
      stack0xfffffffffffffc30 = 0;
      uStack_3cb = 0;
      iStack_3c8 = 0;
      bStack_3c4 = false;
      pcVar25 = pcVar28;
      if (((cpp_dec_float<200U,_int,_void> *)local_438 != pcVar24) &&
         (pcVar25 = pcVar24, (cpp_dec_float<200U,_int,_void> *)local_438 != pcVar28)) {
        pcVar22 = pcVar28;
        pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_438;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
          pcVar27 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar27 + (ulong)bVar33 * -8 + 4);
        }
        iStack_3c8 = pcVar28->exp;
        bStack_3c4 = pcVar28->neg;
        local_3c0._0_4_ = pcVar28->fpclass;
        local_3c0._4_4_ = pcVar28->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                ((cpp_dec_float<200U,_int,_void> *)local_438,pcVar25);
      pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_438;
      puVar21 = (uint *)local_348;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        *puVar21 = (pcVar25->data)._M_elems[0];
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar33 * -8 + 4);
        puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
      }
      iStack_2d8 = iStack_3c8;
      bStack_2d4 = bStack_3c4;
      local_2d0._0_4_ = (fpclass_type)local_3c0;
      local_2d0._4_4_ = local_3c0._4_4_;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar24,0);
      puVar21 = (uint *)local_348;
      pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_438;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pcVar24->data)._M_elems[0] = *puVar21;
        puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4);
      }
      pnVar23 = eps;
      pcVar24 = &local_b0;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pcVar24->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + ((ulong)bVar33 * -2 + 1) * 4);
        pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + ((ulong)bVar33 * -2 + 1) * 4);
      }
      local_b0.exp = (eps->m_backend).exp;
      local_b0.neg = (eps->m_backend).neg;
      local_b0.fpclass = (eps->m_backend).fpclass;
      local_b0.prec_elem = (eps->m_backend).prec_elem;
      iStack_3c8 = iStack_2d8;
      bStack_3c4 = bStack_2d4;
      local_3c0._0_4_ = (fpclass_type)local_2d0;
      local_3c0._4_4_ = local_2d0._4_4_;
      if ((bStack_2d4 == true) &&
         (local_438._0_4_ != 0 || (fpclass_type)local_2d0 != cpp_dec_float_finite)) {
        bStack_3c4 = false;
      }
      rn = uVar29;
      if ((local_b0.fpclass != cpp_dec_float_NaN && (fpclass_type)local_2d0 != cpp_dec_float_NaN) &&
         (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_438,&local_b0), 0 < iVar8)) {
        iVar8 = local_368[local_390];
        local_3a0 = uVar31;
        local_358[(int)uVar31] = iVar8;
        puVar21 = (uint *)local_348;
        pnVar23 = local_360 + iVar8;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar23->m_backend).data._M_elems[0] = *puVar21;
          puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
          pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar23 + ((ulong)bVar33 * -2 + 1) * 4);
        }
        local_360[iVar8].m_backend.exp = iStack_2d8;
        local_360[iVar8].m_backend.neg = bStack_2d4;
        local_360[iVar8].m_backend.fpclass = (fpclass_type)local_2d0;
        local_360[iVar8].m_backend.prec_elem = local_2d0._4_4_;
        if (0 < local_370[iVar8]) {
          piVar18 = local_378 + local_388[iVar8];
          pcVar24 = &local_380[local_388[iVar8]].m_backend;
          iVar8 = local_370[iVar8];
          do {
            iVar10 = *piVar18;
            pnVar23 = local_3a8 + iVar10;
            pnVar20 = pnVar23;
            puVar21 = (uint *)local_2b8;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              *puVar21 = (pnVar20->m_backend).data._M_elems[0];
              pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar20 + ((ulong)bVar33 * -2 + 1) * 4);
              puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
            }
            iStack_248 = local_3a8[iVar10].m_backend.exp;
            bStack_244 = local_3a8[iVar10].m_backend.neg;
            fVar1 = local_3a8[iVar10].m_backend.fpclass;
            iVar3 = local_3a8[iVar10].m_backend.prec_elem;
            local_240._0_4_ = fVar1;
            local_240._4_4_ = iVar3;
            if (fVar1 == cpp_dec_float_NaN) {
LAB_00534b05:
              local_3c0._0_4_ = cpp_dec_float_finite;
              local_3c0._4_4_ = 0x1c;
              local_438 = (undefined1  [16])0x0;
              local_428 = (undefined1  [16])0x0;
              local_418 = (undefined1  [16])0x0;
              local_408 = (undefined1  [16])0x0;
              local_3f8 = (undefined1  [16])0x0;
              local_3e8 = (undefined1  [16])0x0;
              local_3d8[0] = 0;
              local_3d8[1] = 0;
              stack0xfffffffffffffc30 = 0;
              uStack_3cb = 0;
              iStack_3c8 = 0;
              bStack_3c4 = false;
              pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_348;
              if ((cpp_dec_float<200U,_int,_void> *)local_438 != pcVar24) {
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_438;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar28->data)._M_elems[0] = (pcVar25->data)._M_elems[0];
                  pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar25 + (ulong)bVar33 * -8 + 4);
                  pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar28 + (ulong)bVar33 * -8 + 4);
                }
                iStack_3c8 = iStack_2d8;
                bStack_3c4 = bStack_2d4;
                local_3c0._0_4_ = (fpclass_type)local_2d0;
                local_3c0._4_4_ = local_2d0._4_4_;
                pcVar25 = pcVar24;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_438,pcVar25);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_2b8,
                         (cpp_dec_float<200U,_int,_void> *)local_438);
              a = 0.0;
              if ((fpclass_type)local_240 != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_438,0,(type *)0x0);
                iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_2b8,
                                    (cpp_dec_float<200U,_int,_void> *)local_438);
                a = 0.0;
                if (iVar10 == 0) {
                  a = 1e-100;
                }
              }
              local_3c0._0_4_ = cpp_dec_float_finite;
              local_3c0._4_4_ = 0x1c;
              local_438 = ZEXT816(0);
              local_428 = ZEXT816(0);
              local_418 = ZEXT816(0);
              local_408 = ZEXT816(0);
              local_3f8 = ZEXT816(0);
              local_3e8 = ZEXT816(0);
              local_3d8[0] = 0;
              local_3d8[1] = 0;
              stack0xfffffffffffffc30 = 0;
              uStack_3cb = 0;
              iStack_3c8 = 0;
              bStack_3c4 = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_438,a);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_2b8,
                         (cpp_dec_float<200U,_int,_void> *)local_438);
              pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
              pnVar20 = pnVar23;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pnVar20->m_backend).data._M_elems[0] = (pcVar25->data)._M_elems[0];
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar33 * -8 + 4)
                ;
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar33 * -2 + 1) * 4);
              }
              (pnVar23->m_backend).exp = iStack_248;
              (pnVar23->m_backend).neg = bStack_244;
              (pnVar23->m_backend).fpclass = (fpclass_type)local_240;
              (pnVar23->m_backend).prec_elem = local_240._4_4_;
              ridx = local_350;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_438,0,(type *)0x0);
              iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_2b8,
                                 (cpp_dec_float<200U,_int,_void> *)local_438);
              iVar11 = iStack_2d8;
              if (iVar9 != 0) goto LAB_00534b05;
              puVar21 = (uint *)local_348;
              pcVar25 = &local_230;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar25->data)._M_elems[0] = *puVar21;
                puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar25 + ((ulong)bVar33 * -2 + 1) * 4);
              }
              local_230.exp = iStack_2d8;
              local_230.neg = bStack_2d4;
              fVar6 = (fpclass_type)local_2d0;
              local_230.fpclass = (fpclass_type)local_2d0;
              iVar7 = local_2d0._4_4_;
              local_230.prec_elem = local_2d0._4_4_;
              bVar16 = bStack_2d4;
              if (local_230.data._M_elems[0] != 0 || (fpclass_type)local_2d0 != cpp_dec_float_finite
                 ) {
                bVar16 = bStack_2d4 ^ 1;
                local_230.neg = (bool)bVar16;
              }
              local_3c0._0_4_ = cpp_dec_float_finite;
              local_3c0._4_4_ = 0x1c;
              local_438 = (undefined1  [16])0x0;
              local_428 = (undefined1  [16])0x0;
              local_418 = (undefined1  [16])0x0;
              local_408 = (undefined1  [16])0x0;
              local_3f8 = (undefined1  [16])0x0;
              local_3e8 = (undefined1  [16])0x0;
              local_3d8[0] = 0;
              local_3d8[1] = 0;
              stack0xfffffffffffffc30 = 0;
              uStack_3cb = 0;
              iStack_3c8 = 0;
              bStack_3c4 = false;
              pcVar25 = &local_230;
              local_230.neg = (bool)bVar16;
              if ((cpp_dec_float<200U,_int,_void> *)local_438 != pcVar24) {
                puVar21 = (uint *)local_348;
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_438;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pcVar25->data)._M_elems[0] = *puVar21;
                  puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
                  pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar25 + (ulong)bVar33 * -8 + 4);
                }
                iStack_3c8 = iVar11;
                local_3c0._0_4_ = fVar6;
                local_3c0._4_4_ = iVar7;
                pcVar25 = pcVar24;
                bStack_3c4 = (bool)bVar16;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_438,pcVar25);
              pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_438;
              puVar21 = (uint *)local_2b8;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                *puVar21 = (pcVar25->data)._M_elems[0];
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar33 * -8 + 4)
                ;
                puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
              }
              iStack_248 = iStack_3c8;
              bStack_244 = bStack_3c4;
              local_240._0_4_ = (fpclass_type)local_3c0;
              local_240._4_4_ = local_3c0._4_4_;
              puVar21 = (uint *)local_2b8;
              pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_438;
              for (lVar14 = 0x1c; ridx = local_350, lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar25->data)._M_elems[0] = *puVar21;
                puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar33 * -8 + 4)
                ;
              }
              pnVar20 = eps;
              pcVar25 = &local_130;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pcVar25->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar33 * -2 + 1) * 4);
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar25 + ((ulong)bVar33 * -2 + 1) * 4);
              }
              local_130.exp = (eps->m_backend).exp;
              local_130.neg = (eps->m_backend).neg;
              fVar2 = (eps->m_backend).fpclass;
              iVar4 = (eps->m_backend).prec_elem;
              local_130.fpclass = fVar2;
              local_130.prec_elem = iVar4;
              if ((bStack_3c4 == true) &&
                 (local_438._0_4_ != 0 || (fpclass_type)local_3c0 != cpp_dec_float_finite)) {
                bStack_3c4 = false;
              }
              if ((fVar2 != cpp_dec_float_NaN && (fpclass_type)local_3c0 != cpp_dec_float_NaN) &&
                 (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_438,&local_130),
                 0 < iVar11)) {
                puVar21 = (uint *)local_2b8;
                pnVar20 = pnVar23;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  (pnVar20->m_backend).data._M_elems[0] = *puVar21;
                  puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
                  pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar20 + ((ulong)bVar33 * -2 + 1) * 4);
                }
                (pnVar23->m_backend).exp = iStack_248;
                (pnVar23->m_backend).neg = bStack_244;
                (pnVar23->m_backend).fpclass = (fpclass_type)local_240;
                (pnVar23->m_backend).prec_elem = local_240._4_4_;
                iVar10 = local_2c0[iVar10];
                uVar17 = (uint)local_440;
                uVar29 = uVar17;
                if (0 < (int)uVar17) {
                  do {
                    uVar19 = (uint)local_440 - 1;
                    uVar13 = uVar19 >> 1;
                    uVar29 = (uint)local_440;
                    if (iVar10 <= ridx[uVar13]) break;
                    ridx[local_440] = ridx[uVar13];
                    local_440 = (ulong)uVar13;
                    uVar29 = uVar13;
                  } while (1 < uVar19);
                }
                local_440 = (ulong)(uVar17 + 1);
                ridx[(int)uVar29] = iVar10;
              }
            }
            piVar18 = piVar18 + 1;
            pcVar24 = pcVar24 + 1;
            bVar5 = 1 < iVar8;
            iVar8 = iVar8 + -1;
            uVar29 = (uint)local_440;
          } while (bVar5);
        }
        local_440._0_4_ = uVar29;
        uVar31 = (ulong)((int)local_3a0 + 1);
        piVar18 = local_3b0;
        rn = (uint)local_440;
        if ((double)(int)local_390 * 0.2 < (double)(int)(uint)local_440) {
          if (-1 < (long)*ridx) {
            lVar14 = (long)*ridx;
            do {
              pcVar24 = &local_3a8[piVar18[lVar14]].m_backend;
              pcVar28 = &(local_398->diag).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[piVar18[lVar14]].m_backend;
              local_3c0._0_4_ = cpp_dec_float_finite;
              local_3c0._4_4_ = 0x1c;
              local_438 = ZEXT816(0);
              local_428 = ZEXT816(0);
              local_418 = ZEXT816(0);
              local_408 = ZEXT816(0);
              local_3f8 = ZEXT816(0);
              local_3e8 = ZEXT816(0);
              local_3d8[0] = 0;
              local_3d8[1] = 0;
              stack0xfffffffffffffc30 = 0;
              uStack_3cb = 0;
              iStack_3c8 = 0;
              bStack_3c4 = false;
              pcVar25 = pcVar28;
              if (((cpp_dec_float<200U,_int,_void> *)local_438 != pcVar24) &&
                 (pcVar25 = pcVar24, (cpp_dec_float<200U,_int,_void> *)local_438 != pcVar28)) {
                pcVar22 = pcVar28;
                pcVar27 = (cpp_dec_float<200U,_int,_void> *)local_438;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  (pcVar27->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar22 + (ulong)bVar33 * -8 + 4);
                  pcVar27 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar27 + (ulong)bVar33 * -8 + 4);
                }
                iStack_3c8 = pcVar28->exp;
                bStack_3c4 = pcVar28->neg;
                local_3c0._0_4_ = pcVar28->fpclass;
                local_3c0._4_4_ = pcVar28->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_438,pcVar25);
              pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_438;
              pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_348;
              for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                (pcVar28->data)._M_elems[0] = (pcVar25->data)._M_elems[0];
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar33 * -8 + 4)
                ;
                pcVar28 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar28 + (ulong)bVar33 * -8 + 4)
                ;
              }
              iStack_2d8 = iStack_3c8;
              bStack_2d4 = bStack_3c4;
              local_2d0._0_4_ = (fpclass_type)local_3c0;
              local_2d0._4_4_ = local_3c0._4_4_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar24,0);
              pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_348;
              pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_438;
              for (lVar15 = 0x1c; piVar18 = local_3b0, lVar15 != 0; lVar15 = lVar15 + -1) {
                (pcVar25->data)._M_elems[0] = (pcVar24->data)._M_elems[0];
                pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4)
                ;
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar33 * -8 + 4)
                ;
              }
              pnVar23 = eps;
              pcVar24 = &local_1b0;
              for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                (pcVar24->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
                pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar23 + ((ulong)bVar33 * -2 + 1) * 4);
                pcVar24 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar24 + (ulong)bVar33 * -8 + 4)
                ;
              }
              local_1b0.exp = (eps->m_backend).exp;
              local_1b0.neg = (eps->m_backend).neg;
              local_1b0.fpclass = (eps->m_backend).fpclass;
              local_1b0.prec_elem = (eps->m_backend).prec_elem;
              iStack_3c8 = iStack_2d8;
              bStack_3c4 = bStack_2d4;
              local_3c0._0_4_ = (fpclass_type)local_2d0;
              local_3c0._4_4_ = local_2d0._4_4_;
              if ((bStack_2d4 == true) &&
                 (local_438._0_4_ != 0 || (fpclass_type)local_2d0 != cpp_dec_float_finite)) {
                bStack_3c4 = false;
              }
              if ((local_1b0.fpclass != cpp_dec_float_NaN &&
                   (fpclass_type)local_2d0 != cpp_dec_float_NaN) &&
                 (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)local_438,&local_1b0),
                 0 < iVar8)) {
                iVar8 = local_368[lVar14];
                uVar32 = (ulong)((int)uVar31 + 1);
                local_358[(int)uVar31] = iVar8;
                pcVar24 = (cpp_dec_float<200U,_int,_void> *)local_348;
                pnVar23 = local_360 + iVar8;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  (pnVar23->m_backend).data._M_elems[0] = (pcVar24->data)._M_elems[0];
                  pcVar24 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar24 + (ulong)bVar33 * -8 + 4);
                  pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar23 + ((ulong)bVar33 * -2 + 1) * 4);
                }
                local_360[iVar8].m_backend.exp = iStack_2d8;
                local_360[iVar8].m_backend.neg = bStack_2d4;
                local_360[iVar8].m_backend.fpclass = (fpclass_type)local_2d0;
                local_360[iVar8].m_backend.prec_elem = local_2d0._4_4_;
                uVar31 = uVar32;
                if (0 < local_370[iVar8]) {
                  local_3a0 = uVar32;
                  piVar30 = local_378 + local_388[iVar8];
                  pcVar24 = &local_380[local_388[iVar8]].m_backend;
                  uVar29 = local_370[iVar8] + 1;
                  do {
                    local_3c0._0_4_ = cpp_dec_float_finite;
                    local_3c0._4_4_ = 0x1c;
                    local_438 = (undefined1  [16])0x0;
                    local_428 = (undefined1  [16])0x0;
                    local_418 = (undefined1  [16])0x0;
                    local_408 = (undefined1  [16])0x0;
                    local_3f8 = (undefined1  [16])0x0;
                    local_3e8 = (undefined1  [16])0x0;
                    local_3d8[0] = 0;
                    local_3d8[1] = 0;
                    stack0xfffffffffffffc30 = 0;
                    uStack_3cb = 0;
                    iStack_3c8 = 0;
                    bStack_3c4 = false;
                    pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_348;
                    if (pcVar24 != (cpp_dec_float<200U,_int,_void> *)local_438) {
                      pcVar28 = (cpp_dec_float<200U,_int,_void> *)local_438;
                      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                        (pcVar28->data)._M_elems[0] = (pcVar25->data)._M_elems[0];
                        pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar25 + (ulong)bVar33 * -8 + 4);
                        pcVar28 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar28 + (ulong)bVar33 * -8 + 4);
                      }
                      iStack_3c8 = iStack_2d8;
                      bStack_3c4 = bStack_2d4;
                      local_3c0._0_4_ = (fpclass_type)local_2d0;
                      local_3c0._4_4_ = local_2d0._4_4_;
                      pcVar25 = pcVar24;
                    }
                    pcVar24 = pcVar24 + 1;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                              ((cpp_dec_float<200U,_int,_void> *)local_438,pcVar25);
                    iVar8 = *piVar30;
                    piVar30 = piVar30 + 1;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                              (&local_3a8[iVar8].m_backend,
                               (cpp_dec_float<200U,_int,_void> *)local_438);
                    uVar29 = uVar29 - 1;
                    piVar18 = local_3b0;
                    uVar31 = local_3a0;
                  } while (1 < uVar29);
                }
              }
              bVar5 = 0 < lVar14;
              lVar14 = lVar14 + -1;
            } while (bVar5);
          }
          break;
        }
      }
    } while (0 < rn);
  }
  return (int)uVar31;
}

Assistant:

int CLUFactor<R>::vSolveUright(R* vec, int* vidx,
                               R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c, n;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   n = 0;

   while(rn > 0)
   {
      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);
      assert(i >= 0 && i < thedim);
      r = rorig[i];
      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];
      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         assert(c >= 0 && c < thedim);
         vidx[n++] = c;
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            assert(*idx >= 0 && *idx < thedim);
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }

         if(rn > i * verySparseFactor4right)
         {
            /* continue with dense case */
            for(i = *ridx; i >= 0; --i)
            {
               r = rorig[i];
               assert(r >= 0 && r < thedim);
               x = diag[r] * rhs[r];
               rhs[r] = 0;

               if(isNotZero(x, eps))
               {
                  c = corig[i];
                  assert(c >= 0 && c < thedim);
                  vidx[n++] = c;
                  vec[c] = x;
                  val = &cval[cbeg[c]];
                  idx = &cidx[cbeg[c]];
                  j = clen[c];

                  while(j-- > 0)
                  {
                     assert(*idx >= 0 && *idx < thedim);
                     rhs[*idx++] -= x * (*val++);
                  }
               }
            }

            break;
         }
      }
   }

   return n;
}